

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg.cpp
# Opt level: O0

void __thiscall MppEncCfgService::MppEncCfgService(MppEncCfgService *this)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  undefined8 local_e88;
  MppCfgInfo tmp_184;
  MppCfgInfo tmp_183;
  MppCfgInfo tmp_182;
  MppCfgInfo tmp_181;
  MppCfgInfo tmp_180;
  MppCfgInfo tmp_179;
  MppCfgInfo tmp_178;
  MppCfgInfo tmp_177;
  MppCfgInfo tmp_176;
  MppCfgInfo tmp_175;
  MppCfgInfo tmp_174;
  MppCfgInfo tmp_173;
  MppCfgInfo tmp_172;
  MppCfgInfo tmp_171;
  MppCfgInfo tmp_170;
  MppCfgInfo tmp_169;
  MppCfgInfo tmp_168;
  MppCfgInfo tmp_167;
  MppCfgInfo tmp_166;
  MppCfgInfo tmp_165;
  MppCfgInfo tmp_164;
  MppCfgInfo tmp_163;
  MppCfgInfo tmp_162;
  MppCfgInfo tmp_161;
  MppCfgInfo tmp_160;
  MppCfgInfo tmp_159;
  MppCfgInfo tmp_158;
  MppCfgInfo tmp_157;
  MppCfgInfo tmp_156;
  MppCfgInfo tmp_155;
  MppCfgInfo tmp_154;
  MppCfgInfo tmp_153;
  MppCfgInfo tmp_152;
  MppCfgInfo tmp_151;
  MppCfgInfo tmp_150;
  MppCfgInfo tmp_149;
  MppCfgInfo tmp_148;
  MppCfgInfo tmp_147;
  MppCfgInfo tmp_146;
  MppCfgInfo tmp_145;
  MppCfgInfo tmp_144;
  MppCfgInfo tmp_143;
  MppCfgInfo tmp_142;
  MppCfgInfo tmp_141;
  MppCfgInfo tmp_140;
  MppCfgInfo tmp_139;
  MppCfgInfo tmp_138;
  MppCfgInfo tmp_137;
  MppCfgInfo tmp_136;
  MppCfgInfo tmp_135;
  MppCfgInfo tmp_134;
  MppCfgInfo tmp_133;
  MppCfgInfo tmp_132;
  MppCfgInfo tmp_131;
  MppCfgInfo tmp_130;
  MppCfgInfo tmp_129;
  MppCfgInfo tmp_128;
  MppCfgInfo tmp_127;
  MppCfgInfo tmp_126;
  MppCfgInfo tmp_125;
  MppCfgInfo tmp_124;
  MppCfgInfo tmp_123;
  MppCfgInfo tmp_122;
  MppCfgInfo tmp_121;
  MppCfgInfo tmp_120;
  MppCfgInfo tmp_119;
  MppCfgInfo tmp_118;
  MppCfgInfo tmp_117;
  MppCfgInfo tmp_116;
  MppCfgInfo tmp_115;
  MppCfgInfo tmp_114;
  MppCfgInfo tmp_113;
  MppCfgInfo tmp_112;
  MppCfgInfo tmp_111;
  MppCfgInfo tmp_110;
  MppCfgInfo tmp_109;
  MppCfgInfo tmp_108;
  MppCfgInfo tmp_107;
  MppCfgInfo tmp_106;
  MppCfgInfo tmp_105;
  MppCfgInfo tmp_104;
  MppCfgInfo tmp_103;
  MppCfgInfo tmp_102;
  MppCfgInfo tmp_101;
  MppCfgInfo tmp_100;
  MppCfgInfo tmp_99;
  MppCfgInfo tmp_98;
  MppCfgInfo tmp_97;
  MppCfgInfo tmp_96;
  MppCfgInfo tmp_95;
  MppCfgInfo tmp_94;
  MppCfgInfo tmp_93;
  MppCfgInfo tmp_92;
  MppCfgInfo tmp_91;
  MppCfgInfo tmp_90;
  MppCfgInfo tmp_89;
  MppCfgInfo tmp_88;
  MppCfgInfo tmp_87;
  MppCfgInfo tmp_86;
  MppCfgInfo tmp_85;
  MppCfgInfo tmp_84;
  MppCfgInfo tmp_83;
  MppCfgInfo tmp_82;
  MppCfgInfo tmp_81;
  MppCfgInfo tmp_80;
  MppCfgInfo tmp_79;
  MppCfgInfo tmp_78;
  MppCfgInfo tmp_77;
  MppCfgInfo tmp_76;
  MppCfgInfo tmp_75;
  MppCfgInfo tmp_74;
  MppCfgInfo tmp_73;
  MppCfgInfo tmp_72;
  MppCfgInfo tmp_71;
  MppCfgInfo tmp_70;
  MppCfgInfo tmp_69;
  MppCfgInfo tmp_68;
  MppCfgInfo tmp_67;
  MppCfgInfo tmp_66;
  MppCfgInfo tmp_65;
  MppCfgInfo tmp_64;
  MppCfgInfo tmp_63;
  MppCfgInfo tmp_62;
  MppCfgInfo tmp_61;
  MppCfgInfo tmp_60;
  MppCfgInfo tmp_59;
  MppCfgInfo tmp_58;
  MppCfgInfo tmp_57;
  MppCfgInfo tmp_56;
  MppCfgInfo tmp_55;
  MppCfgInfo tmp_54;
  MppCfgInfo tmp_53;
  MppCfgInfo tmp_52;
  MppCfgInfo tmp_51;
  MppCfgInfo tmp_50;
  MppCfgInfo tmp_49;
  MppCfgInfo tmp_48;
  MppCfgInfo tmp_47;
  MppCfgInfo tmp_46;
  MppCfgInfo tmp_45;
  MppCfgInfo tmp_44;
  MppCfgInfo tmp_43;
  MppCfgInfo tmp_42;
  MppCfgInfo tmp_41;
  MppCfgInfo tmp_40;
  MppCfgInfo tmp_39;
  MppCfgInfo tmp_38;
  MppCfgInfo tmp_37;
  MppCfgInfo tmp_36;
  MppCfgInfo tmp_35;
  MppCfgInfo tmp_34;
  MppCfgInfo tmp_33;
  MppCfgInfo tmp_32;
  MppCfgInfo tmp_31;
  MppCfgInfo tmp_30;
  MppCfgInfo tmp_29;
  MppCfgInfo tmp_28;
  MppCfgInfo tmp_27;
  MppCfgInfo tmp_26;
  MppCfgInfo tmp_25;
  MppCfgInfo tmp_24;
  MppCfgInfo tmp_23;
  MppCfgInfo tmp_22;
  MppCfgInfo tmp_21;
  MppCfgInfo tmp_20;
  MppCfgInfo tmp_19;
  MppCfgInfo tmp_18;
  MppCfgInfo tmp_17;
  MppCfgInfo tmp_16;
  MppCfgInfo tmp_15;
  MppCfgInfo tmp_14;
  MppCfgInfo tmp_13;
  MppCfgInfo tmp_12;
  MppCfgInfo tmp_11;
  MppCfgInfo tmp_10;
  MppCfgInfo tmp_9;
  MppCfgInfo tmp_8;
  MppCfgInfo tmp_7;
  MppCfgInfo tmp_6;
  MppCfgInfo tmp_5;
  MppCfgInfo tmp_4;
  MppCfgInfo tmp_3;
  MppCfgInfo tmp_2;
  MppCfgInfo tmp_1;
  MppCfgInfo tmp;
  MPP_RET ret;
  MppEncCfgService *this_local;
  
  this->mTrie = (MppTrie)0x0;
  mpp_env_get_u32("mpp_enc_cfg_debug",&mpp_enc_cfg_debug,0);
  MVar1 = mpp_trie_init(&this->mTrie,"MppEncCfg");
  if (MVar1 == MPP_OK) {
    tmp_1.data_offset = 0;
    tmp_1.data_size = 0;
    mpp_trie_add_info(this->mTrie,"base:low_delay",&tmp_1.data_offset,0x14);
    tmp_2.data_offset = 0;
    tmp_2.data_size = 0x90;
    tmp_1.data_type = CFG_FUNC_TYPE_U32;
    tmp_1.flag_offset = 0x94;
    tmp_1.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:mode",&tmp_2.data_offset,0x14);
    tmp_3.data_offset = 0;
    tmp_3.data_size = 0x90;
    tmp_2.data_type = CFG_FUNC_TYPE_St;
    tmp_2.flag_offset = 0x9c;
    tmp_2.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:bps_target",&tmp_3.data_offset,0x14);
    tmp_4.data_offset = 0;
    tmp_4.data_size = 0x90;
    tmp_3.data_type = CFG_FUNC_TYPE_St;
    tmp_3.flag_offset = 0xa0;
    tmp_3.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:bps_max",&tmp_4.data_offset,0x14);
    tmp_5.data_offset = 0;
    tmp_5.data_size = 0x90;
    tmp_4.data_type = CFG_FUNC_TYPE_St;
    tmp_4.flag_offset = 0xa4;
    tmp_4.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:bps_min",&tmp_5.data_offset,0x14);
    tmp_6.data_offset = 0;
    tmp_6.data_size = 0x90;
    tmp_5.data_type = 0x20;
    tmp_5.flag_offset = 0xa8;
    tmp_5.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fps_in_flex",&tmp_6.data_offset,0x14);
    tmp_7.data_offset = 0;
    tmp_7.data_size = 0x90;
    tmp_6.data_type = 0x20;
    tmp_6.flag_offset = 0xac;
    tmp_6.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fps_in_num",&tmp_7.data_offset,0x14);
    tmp_8.data_offset = 0;
    tmp_8.data_size = 0x90;
    tmp_7.data_type = 0x20;
    tmp_7.flag_offset = 0xb0;
    tmp_7.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fps_in_denom",&tmp_8.data_offset,0x14);
    tmp_9.data_offset = 0;
    tmp_9.data_size = 0x90;
    tmp_8.data_type = 0x20;
    tmp_8.flag_offset = 0xb0;
    tmp_8.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fps_in_denorm",&tmp_9.data_offset,0x14);
    tmp_10.data_offset = 0;
    tmp_10.data_size = 0x90;
    tmp_9.data_type = 0x40;
    tmp_9.flag_offset = 0xb4;
    tmp_9.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fps_out_flex",&tmp_10.data_offset,0x14);
    tmp_11.data_offset = 0;
    tmp_11.data_size = 0x90;
    tmp_10.data_type = 0x40;
    tmp_10.flag_offset = 0xb8;
    tmp_10.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fps_out_num",&tmp_11.data_offset,0x14);
    tmp_12.data_offset = 0;
    tmp_12.data_size = 0x90;
    tmp_11.data_type = 0x40;
    tmp_11.flag_offset = 0xbc;
    tmp_11.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fps_out_denom",&tmp_12.data_offset,0x14);
    tmp_13.data_offset = 0;
    tmp_13.data_size = 0x90;
    tmp_12.data_type = 0x40;
    tmp_12.flag_offset = 0xbc;
    tmp_12.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fps_out_denorm",&tmp_13.data_offset,0x14);
    tmp_14.data_offset = 0;
    tmp_14.data_size = 0x90;
    tmp_13.data_type = 0x40;
    tmp_13.flag_offset = 0xc0;
    tmp_13.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fps_chg_no_idr",&tmp_14.data_offset,0x14);
    tmp_15.data_offset = 0;
    tmp_15.data_size = 0x90;
    tmp_14.data_type = 0x80;
    tmp_14.flag_offset = 0xc4;
    tmp_14.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:gop",&tmp_15.data_offset,0x14);
    tmp_16.data_offset = 5;
    tmp_16.data_size = 0x90;
    tmp_15.data_type = 0x10000000;
    tmp_15.flag_offset = 200;
    tmp_15.flag_value = 8;
    mpp_trie_add_info(this->mTrie,"rc:ref_cfg",&tmp_16.data_offset,0x14);
    tmp_17.data_offset = 1;
    tmp_17.data_size = 0x90;
    tmp_16.data_type = 0x200;
    tmp_16.flag_offset = 0xd4;
    tmp_16.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:max_reenc_times",&tmp_17.data_offset,0x14);
    tmp_18.data_offset = 1;
    tmp_18.data_size = 0x90;
    tmp_17.data_type = 0x4000;
    tmp_17.flag_offset = 0xf4;
    tmp_17.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:priority",&tmp_18.data_offset,0x14);
    tmp_19.data_offset = 1;
    tmp_19.data_size = 0x90;
    tmp_18.data_type = 0x400;
    tmp_18.flag_offset = 0xdc;
    tmp_18.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:drop_mode",&tmp_19.data_offset,0x14);
    tmp_20.data_offset = 1;
    tmp_20.data_size = 0x90;
    tmp_19.data_type = 0x400;
    tmp_19.flag_offset = 0xe0;
    tmp_19.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:drop_thd",&tmp_20.data_offset,0x14);
    tmp_21.data_offset = 1;
    tmp_21.data_size = 0x90;
    tmp_20.data_type = 0x400;
    tmp_20.flag_offset = 0xe4;
    tmp_20.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:drop_gap",&tmp_21.data_offset,0x14);
    tmp_22.data_offset = 0;
    tmp_22.data_size = 0x90;
    tmp_21.data_type = 0x800;
    tmp_21.flag_offset = 0x100;
    tmp_21.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:max_i_prop",&tmp_22.data_offset,0x14);
    tmp_23.data_offset = 0;
    tmp_23.data_size = 0x90;
    tmp_22.data_type = 0x1000;
    tmp_22.flag_offset = 0x104;
    tmp_22.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:min_i_prop",&tmp_23.data_offset,0x14);
    tmp_24.data_offset = 0;
    tmp_24.data_size = 0x90;
    tmp_23.data_type = 0x2000;
    tmp_23.flag_offset = 0x108;
    tmp_23.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:init_ip_ratio",&tmp_24.data_offset,0x14);
    tmp_25.data_offset = 1;
    tmp_25.data_size = 0x90;
    tmp_24.data_type = 0x8000;
    tmp_24.flag_offset = 0xe8;
    tmp_24.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:super_mode",&tmp_25.data_offset,0x14);
    tmp_26.data_offset = 1;
    tmp_26.data_size = 0x90;
    tmp_25.data_type = 0x8000;
    tmp_25.flag_offset = 0xec;
    tmp_25.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:super_i_thd",&tmp_26.data_offset,0x14);
    tmp_27.data_offset = 1;
    tmp_27.data_size = 0x90;
    tmp_26.data_type = 0x8000;
    tmp_26.flag_offset = 0xf0;
    tmp_26.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:super_p_thd",&tmp_27.data_offset,0x14);
    tmp_28.data_offset = 1;
    tmp_28.data_size = 0x90;
    tmp_27.data_type = 0x1000000;
    tmp_27.flag_offset = 0xf8;
    tmp_27.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:debreath_en",&tmp_28.data_offset,0x14);
    tmp_29.data_offset = 1;
    tmp_29.data_size = 0x90;
    tmp_28.data_type = 0x1000000;
    tmp_28.flag_offset = 0xfc;
    tmp_28.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:debreath_strength",&tmp_29.data_offset,0x14);
    tmp_30.data_offset = 0;
    tmp_30.data_size = 0x90;
    tmp_29.data_type = 0x10000;
    tmp_29.flag_offset = 0x10c;
    tmp_29.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:qp_init",&tmp_30.data_offset,0x14);
    tmp_31.data_offset = 0;
    tmp_31.data_size = 0x90;
    tmp_30.data_type = 0x20000;
    tmp_30.flag_offset = 0x118;
    tmp_30.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:qp_min",&tmp_31.data_offset,0x14);
    tmp_32.data_offset = 0;
    tmp_32.data_size = 0x90;
    tmp_31.data_type = 0x20000;
    tmp_31.flag_offset = 0x110;
    tmp_31.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:qp_max",&tmp_32.data_offset,0x14);
    tmp_33.data_offset = 0;
    tmp_33.data_size = 0x90;
    tmp_32.data_type = 0x40000;
    tmp_32.flag_offset = 0x11c;
    tmp_32.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:qp_min_i",&tmp_33.data_offset,0x14);
    tmp_34.data_offset = 0;
    tmp_34.data_size = 0x90;
    tmp_33.data_type = 0x40000;
    tmp_33.flag_offset = 0x114;
    tmp_33.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:qp_max_i",&tmp_34.data_offset,0x14);
    tmp_35.data_offset = 0;
    tmp_35.data_size = 0x90;
    tmp_34.data_type = 0x80000;
    tmp_34.flag_offset = 0x120;
    tmp_34.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:qp_step",&tmp_35.data_offset,0x14);
    tmp_36.data_offset = 0;
    tmp_36.data_size = 0x90;
    tmp_35.data_type = 0x100000;
    tmp_35.flag_offset = 0x124;
    tmp_35.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:qp_ip",&tmp_36.data_offset,0x14);
    tmp_37.data_offset = 0;
    tmp_37.data_size = 0x90;
    tmp_36.data_type = 0x200000;
    tmp_36.flag_offset = 0x128;
    tmp_36.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:qp_vi",&tmp_37.data_offset,0x14);
    tmp_38.data_offset = 0;
    tmp_38.data_size = 0x90;
    tmp_37.data_type = 0x2000000;
    tmp_37.flag_offset = 0x140;
    tmp_37.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:hier_qp_en",&tmp_38.data_offset,0x14);
    tmp_39.data_offset = 4;
    tmp_39.data_size = 0x90;
    tmp_38.data_type = 0x2000000;
    tmp_38.flag_offset = 0x144;
    tmp_38.flag_value = 0x10;
    mpp_trie_add_info(this->mTrie,"rc:hier_qp_delta",&tmp_39.data_offset,0x14);
    tmp_40.data_offset = 4;
    tmp_40.data_size = 0x90;
    tmp_39.data_type = 0x2000000;
    tmp_39.flag_offset = 0x154;
    tmp_39.flag_value = 0x10;
    mpp_trie_add_info(this->mTrie,"rc:hier_frame_num",&tmp_40.data_offset,0x14);
    tmp_41.data_offset = 0;
    tmp_41.data_size = 0x90;
    tmp_40.data_type = 0x4000000;
    tmp_40.flag_offset = 0xd8;
    tmp_40.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:stats_time",&tmp_41.data_offset,0x14);
    tmp_42.data_offset = 1;
    tmp_42.data_size = 0x90;
    tmp_41.data_type = 0x8000000;
    tmp_41.flag_offset = 0x164;
    tmp_41.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:refresh_en",&tmp_42.data_offset,0x14);
    tmp_43.data_offset = 1;
    tmp_43.data_size = 0x90;
    tmp_42.data_type = 0x8000000;
    tmp_42.flag_offset = 0x168;
    tmp_42.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:refresh_mode",&tmp_43.data_offset,0x14);
    tmp_44.data_offset = 1;
    tmp_44.data_size = 0x90;
    tmp_43.data_type = 0x8000000;
    tmp_43.flag_offset = 0x16c;
    tmp_43.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:refresh_num",&tmp_44.data_offset,0x14);
    tmp_45.data_offset = 0;
    tmp_45.data_size = 0x90;
    tmp_44.data_type = 0x20000000;
    tmp_44.flag_offset = 300;
    tmp_44.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fqp_min_i",&tmp_45.data_offset,0x14);
    tmp_46.data_offset = 0;
    tmp_46.data_size = 0x90;
    tmp_45.data_type = 0x20000000;
    tmp_45.flag_offset = 0x130;
    tmp_45.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fqp_min_p",&tmp_46.data_offset,0x14);
    tmp_47.data_offset = 0;
    tmp_47.data_size = 0x90;
    tmp_46.data_type = 0x20000000;
    tmp_46.flag_offset = 0x134;
    tmp_46.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fqp_max_i",&tmp_47.data_offset,0x14);
    tmp_48.data_offset = 0;
    tmp_48.data_size = 0x90;
    tmp_47.data_type = 0x20000000;
    tmp_47.flag_offset = 0x138;
    tmp_47.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:fqp_max_p",&tmp_48.data_offset,0x14);
    tmp_49.data_offset = 0;
    tmp_49.data_size = 0x90;
    tmp_48.data_type = 0x20000000;
    tmp_48.flag_offset = 0x13c;
    tmp_48.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"rc:mt_st_swth_frm_qp",&tmp_49.data_offset,0x14);
    tmp_50.data_offset = 0;
    tmp_50.data_size = 8;
    tmp_49.data_type = CFG_FUNC_TYPE_U32;
    tmp_49.flag_offset = 0xc;
    tmp_49.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:width",&tmp_50.data_offset,0x14);
    tmp_51.data_offset = 0;
    tmp_51.data_size = 8;
    tmp_50.data_type = CFG_FUNC_TYPE_U32;
    tmp_50.flag_offset = 0x10;
    tmp_50.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:height",&tmp_51.data_offset,0x14);
    tmp_52.data_offset = 0;
    tmp_52.data_size = 8;
    tmp_51.data_type = CFG_FUNC_TYPE_U32;
    tmp_51.flag_offset = 0x1c;
    tmp_51.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:max_width",&tmp_52.data_offset,0x14);
    tmp_53.data_offset = 0;
    tmp_53.data_size = 8;
    tmp_52.data_type = CFG_FUNC_TYPE_U32;
    tmp_52.flag_offset = 0x20;
    tmp_52.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:max_height",&tmp_53.data_offset,0x14);
    tmp_54.data_offset = 0;
    tmp_54.data_size = 8;
    tmp_53.data_type = CFG_FUNC_TYPE_U32;
    tmp_53.flag_offset = 0x14;
    tmp_53.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:hor_stride",&tmp_54.data_offset,0x14);
    tmp_55.data_offset = 0;
    tmp_55.data_size = 8;
    tmp_54.data_type = CFG_FUNC_TYPE_U32;
    tmp_54.flag_offset = 0x18;
    tmp_54.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:ver_stride",&tmp_55.data_offset,0x14);
    tmp_56.data_offset = 0;
    tmp_56.data_size = 8;
    tmp_55.data_type = CFG_FUNC_TYPE_St;
    tmp_55.flag_offset = 0x24;
    tmp_55.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:format",&tmp_56.data_offset,0x14);
    tmp_57.data_offset = 0;
    tmp_57.data_size = 8;
    tmp_56.data_type = CFG_FUNC_TYPE_St;
    tmp_56.flag_offset = 0x38;
    tmp_56.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:format_out",&tmp_57.data_offset,0x14);
    tmp_58.data_offset = 0;
    tmp_58.data_size = 8;
    tmp_57.data_type = CFG_FUNC_TYPE_St;
    tmp_57.flag_offset = 0x3c;
    tmp_57.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:chroma_ds_mode",&tmp_58.data_offset,0x14);
    tmp_59.data_offset = 0;
    tmp_59.data_size = 8;
    tmp_58.data_type = CFG_FUNC_TYPE_St;
    tmp_58.flag_offset = 0x44;
    tmp_58.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:fix_chroma_en",&tmp_59.data_offset,0x14);
    tmp_60.data_offset = 0;
    tmp_60.data_size = 8;
    tmp_59.data_type = CFG_FUNC_TYPE_St;
    tmp_59.flag_offset = 0x48;
    tmp_59.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:fix_chroma_u",&tmp_60.data_offset,0x14);
    tmp_61.data_offset = 0;
    tmp_61.data_size = 8;
    tmp_60.data_type = CFG_FUNC_TYPE_St;
    tmp_60.flag_offset = 0x4c;
    tmp_60.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:fix_chroma_v",&tmp_61.data_offset,0x14);
    tmp_62.data_offset = 0;
    tmp_62.data_size = 8;
    tmp_61.data_type = 0x20000;
    tmp_61.flag_offset = 0x28;
    tmp_61.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:colorspace",&tmp_62.data_offset,0x14);
    tmp_63.data_offset = 0;
    tmp_63.data_size = 8;
    tmp_62.data_type = 0x40000;
    tmp_62.flag_offset = 0x2c;
    tmp_62.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:colorprim",&tmp_63.data_offset,0x14);
    tmp_64.data_offset = 0;
    tmp_64.data_size = 8;
    tmp_63.data_type = 0x80000;
    tmp_63.flag_offset = 0x30;
    tmp_63.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:colortrc",&tmp_64.data_offset,0x14);
    tmp_65.data_offset = 0;
    tmp_65.data_size = 8;
    tmp_64.data_type = 0x10000;
    tmp_64.flag_offset = 0x34;
    tmp_64.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:colorrange",&tmp_65.data_offset,0x14);
    tmp_66.data_offset = 0;
    tmp_66.data_size = 8;
    tmp_65.data_type = 0x10000;
    tmp_65.flag_offset = 0x34;
    tmp_65.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:range",&tmp_66.data_offset,0x14);
    tmp_67.data_offset = 0;
    tmp_67.data_size = 8;
    tmp_66.data_type = 0x10000;
    tmp_66.flag_offset = 0x40;
    tmp_66.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:range_out",&tmp_67.data_offset,0x14);
    tmp_68.data_offset = 0;
    tmp_68.data_size = 8;
    tmp_67.data_type = 0x10;
    tmp_67.flag_offset = 0x54;
    tmp_67.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:rotation",&tmp_68.data_offset,0x14);
    tmp_69.data_offset = 0;
    tmp_69.data_size = 8;
    tmp_68.data_type = 0x20;
    tmp_68.flag_offset = 0x5c;
    tmp_68.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:mirroring",&tmp_69.data_offset,0x14);
    tmp_70.data_offset = 0;
    tmp_70.data_size = 8;
    tmp_69.data_type = 0x40;
    tmp_69.flag_offset = 0x60;
    tmp_69.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"prep:flip",&tmp_70.data_offset,0x14);
    tmp_71.data_offset = 0;
    tmp_71.data_size = 0x348;
    tmp_70.data_type = CFG_FUNC_TYPE_S32;
    tmp_70.flag_offset = 0x340;
    tmp_70.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"codec:type",&tmp_71.data_offset,0x14);
    tmp_72.data_offset = 0;
    tmp_72.data_size = 0x348;
    tmp_71.data_type = CFG_FUNC_TYPE_U32;
    tmp_71.flag_offset = 0x34c;
    tmp_71.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:stream_type",&tmp_72.data_offset,0x14);
    tmp_73.data_offset = 0;
    tmp_73.data_size = 0x348;
    tmp_72.data_type = CFG_FUNC_TYPE_S64;
    tmp_72.flag_offset = 0x36c;
    tmp_72.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:profile",&tmp_73.data_offset,0x14);
    tmp_74.data_offset = 0;
    tmp_74.data_size = 0x348;
    tmp_73.data_type = CFG_FUNC_TYPE_S64;
    tmp_73.flag_offset = 0x370;
    tmp_73.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:level",&tmp_74.data_offset,0x14);
    tmp_75.data_offset = 1;
    tmp_75.data_size = 0x348;
    tmp_74.data_type = 0x400;
    tmp_74.flag_offset = 0x350;
    tmp_74.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:poc_type",&tmp_75.data_offset,0x14);
    tmp_76.data_offset = 1;
    tmp_76.data_size = 0x348;
    tmp_75.data_type = 0x800;
    tmp_75.flag_offset = 0x354;
    tmp_75.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:log2_max_poc_lsb",&tmp_76.data_offset,0x14);
    tmp_77.data_offset = 1;
    tmp_77.data_size = 0x348;
    tmp_76.data_type = 0x1000;
    tmp_76.flag_offset = 0x358;
    tmp_76.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:log2_max_frm_num",&tmp_77.data_offset,0x14);
    tmp_78.data_offset = 1;
    tmp_78.data_size = 0x348;
    tmp_77.data_type = 0x2000;
    tmp_77.flag_offset = 0x35c;
    tmp_77.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:gaps_not_allowed",&tmp_78.data_offset,0x14);
    tmp_79.data_offset = 0;
    tmp_79.data_size = 0x348;
    tmp_78.data_type = CFG_FUNC_TYPE_St;
    tmp_78.flag_offset = 0x378;
    tmp_78.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:cabac_en",&tmp_79.data_offset,0x14);
    tmp_80.data_offset = 0;
    tmp_80.data_size = 0x348;
    tmp_79.data_type = CFG_FUNC_TYPE_St;
    tmp_79.flag_offset = 0x380;
    tmp_79.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:cabac_idc",&tmp_80.data_offset,0x14);
    tmp_81.data_offset = 0;
    tmp_81.data_size = 0x348;
    tmp_80.data_type = 0x10;
    tmp_80.flag_offset = 0x388;
    tmp_80.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:trans8x8",&tmp_81.data_offset,0x14);
    tmp_82.data_offset = 0;
    tmp_82.data_size = 0x348;
    tmp_81.data_type = 0x20;
    tmp_81.flag_offset = 0x38c;
    tmp_81.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:const_intra",&tmp_82.data_offset,0x14);
    tmp_83.data_offset = 0;
    tmp_83.data_size = 0x348;
    tmp_82.data_type = 0x200;
    tmp_82.flag_offset = 0x390;
    tmp_82.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:scaling_list",&tmp_83.data_offset,0x14);
    tmp_84.data_offset = 0;
    tmp_84.data_size = 0x348;
    tmp_83.data_type = 0x40;
    tmp_83.flag_offset = 0x394;
    tmp_83.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:cb_qp_offset",&tmp_84.data_offset,0x14);
    tmp_85.data_offset = 0;
    tmp_85.data_size = 0x348;
    tmp_84.data_type = 0x40;
    tmp_84.flag_offset = 0x398;
    tmp_84.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:cr_qp_offset",&tmp_85.data_offset,0x14);
    tmp_86.data_offset = 0;
    tmp_86.data_size = 0x348;
    tmp_85.data_type = 0x80;
    tmp_85.flag_offset = 0x39c;
    tmp_85.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:dblk_disable",&tmp_86.data_offset,0x14);
    tmp_87.data_offset = 0;
    tmp_87.data_size = 0x348;
    tmp_86.data_type = 0x80;
    tmp_86.flag_offset = 0x3a0;
    tmp_86.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:dblk_alpha",&tmp_87.data_offset,0x14);
    tmp_88.data_offset = 0;
    tmp_88.data_size = 0x348;
    tmp_87.data_type = 0x80;
    tmp_87.flag_offset = 0x3a4;
    tmp_87.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:dblk_beta",&tmp_88.data_offset,0x14);
    tmp_89.data_offset = 0;
    tmp_89.data_size = 0x90;
    tmp_88.data_type = 0x10000;
    tmp_88.flag_offset = 0x10c;
    tmp_88.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:qp_init",&tmp_89.data_offset,0x14);
    tmp_90.data_offset = 0;
    tmp_90.data_size = 0x90;
    tmp_89.data_type = 0x20000;
    tmp_89.flag_offset = 0x118;
    tmp_89.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:qp_min",&tmp_90.data_offset,0x14);
    tmp_91.data_offset = 0;
    tmp_91.data_size = 0x90;
    tmp_90.data_type = 0x20000;
    tmp_90.flag_offset = 0x110;
    tmp_90.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:qp_max",&tmp_91.data_offset,0x14);
    tmp_92.data_offset = 0;
    tmp_92.data_size = 0x90;
    tmp_91.data_type = 0x40000;
    tmp_91.flag_offset = 0x11c;
    tmp_91.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:qp_min_i",&tmp_92.data_offset,0x14);
    tmp_93.data_offset = 0;
    tmp_93.data_size = 0x90;
    tmp_92.data_type = 0x40000;
    tmp_92.flag_offset = 0x114;
    tmp_92.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:qp_max_i",&tmp_93.data_offset,0x14);
    tmp_94.data_offset = 0;
    tmp_94.data_size = 0x90;
    tmp_93.data_type = 0x80000;
    tmp_93.flag_offset = 0x120;
    tmp_93.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:qp_step",&tmp_94.data_offset,0x14);
    tmp_95.data_offset = 0;
    tmp_95.data_size = 0x90;
    tmp_94.data_type = 0x100000;
    tmp_94.flag_offset = 0x124;
    tmp_94.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:qp_delta_ip",&tmp_95.data_offset,0x14);
    tmp_96.data_offset = 0;
    tmp_96.data_size = 0x348;
    tmp_95.data_type = 0x400000;
    tmp_95.flag_offset = 0x3c8;
    tmp_95.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:max_tid",&tmp_96.data_offset,0x14);
    tmp_97.data_offset = 0;
    tmp_97.data_size = 0x348;
    tmp_96.data_type = 0x200000;
    tmp_96.flag_offset = 0x3c4;
    tmp_96.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:max_ltr",&tmp_97.data_offset,0x14);
    tmp_98.data_offset = 0;
    tmp_98.data_size = 0x348;
    tmp_97.data_type = 0x800000;
    tmp_97.flag_offset = 0x3cc;
    tmp_97.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:prefix_mode",&tmp_98.data_offset,0x14);
    tmp_99.data_offset = 0;
    tmp_99.data_size = 0x348;
    tmp_98.data_type = 0x1000000;
    tmp_98.flag_offset = 0x3d0;
    tmp_98.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:base_layer_pid",&tmp_99.data_offset,0x14);
    tmp_100.data_offset = 1;
    tmp_100.data_size = 0x348;
    tmp_99.data_type = 0x20000000;
    tmp_99.flag_offset = 0x3d4;
    tmp_99.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h264:constraint_set",&tmp_100.data_offset,0x14);
    tmp_101.data_offset = 0;
    tmp_101.data_size = 0x348;
    tmp_100.data_type = CFG_FUNC_TYPE_U32;
    tmp_100.flag_offset = 0x34c;
    tmp_100.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:profile",&tmp_101.data_offset,0x14);
    tmp_102.data_offset = 0;
    tmp_102.data_size = 0x348;
    tmp_101.data_type = CFG_FUNC_TYPE_U32;
    tmp_101.flag_offset = 0x354;
    tmp_101.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:tier",&tmp_102.data_offset,0x14);
    tmp_103.data_offset = 0;
    tmp_103.data_size = 0x348;
    tmp_102.data_type = CFG_FUNC_TYPE_U32;
    tmp_102.flag_offset = 0x350;
    tmp_102.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:level",&tmp_103.data_offset,0x14);
    tmp_104.data_offset = 1;
    tmp_104.data_size = 0x348;
    tmp_103.data_type = 0x4000;
    tmp_103.flag_offset = 0x41c;
    tmp_103.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:scaling_list",&tmp_104.data_offset,0x14);
    tmp_105.data_offset = 0;
    tmp_105.data_size = 0x348;
    tmp_104.data_type = 0x4000;
    tmp_104.flag_offset = 0x420;
    tmp_104.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:cb_qp_offset",&tmp_105.data_offset,0x14);
    tmp_106.data_offset = 0;
    tmp_106.data_size = 0x348;
    tmp_105.data_type = 0x4000;
    tmp_105.flag_offset = 0x424;
    tmp_105.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:cr_qp_offset",&tmp_106.data_offset,0x14);
    tmp_107.data_offset = 0;
    tmp_107.data_size = 0x348;
    tmp_106.data_type = 0x4000;
    tmp_106.flag_offset = 0x428;
    tmp_106.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:diff_cu_qp_delta_depth",&tmp_107.data_offset,0x14);
    tmp_108.data_offset = 1;
    tmp_108.data_size = 0x348;
    tmp_107.data_type = 0x1000;
    tmp_107.flag_offset = 0x438;
    tmp_107.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:dblk_disable",&tmp_108.data_offset,0x14);
    tmp_109.data_offset = 0;
    tmp_109.data_size = 0x348;
    tmp_108.data_type = 0x1000;
    tmp_108.flag_offset = 0x43c;
    tmp_108.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:dblk_alpha",&tmp_109.data_offset,0x14);
    tmp_110.data_offset = 0;
    tmp_110.data_size = 0x348;
    tmp_109.data_type = 0x1000;
    tmp_109.flag_offset = 0x440;
    tmp_109.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:dblk_beta",&tmp_110.data_offset,0x14);
    tmp_111.data_offset = 0;
    tmp_111.data_size = 0x90;
    tmp_110.data_type = 0x10000;
    tmp_110.flag_offset = 0x10c;
    tmp_110.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:qp_init",&tmp_111.data_offset,0x14);
    tmp_112.data_offset = 0;
    tmp_112.data_size = 0x90;
    tmp_111.data_type = 0x20000;
    tmp_111.flag_offset = 0x118;
    tmp_111.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:qp_min",&tmp_112.data_offset,0x14);
    tmp_113.data_offset = 0;
    tmp_113.data_size = 0x90;
    tmp_112.data_type = 0x20000;
    tmp_112.flag_offset = 0x110;
    tmp_112.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:qp_max",&tmp_113.data_offset,0x14);
    tmp_114.data_offset = 0;
    tmp_114.data_size = 0x90;
    tmp_113.data_type = 0x40000;
    tmp_113.flag_offset = 0x11c;
    tmp_113.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:qp_min_i",&tmp_114.data_offset,0x14);
    tmp_115.data_offset = 0;
    tmp_115.data_size = 0x90;
    tmp_114.data_type = 0x40000;
    tmp_114.flag_offset = 0x114;
    tmp_114.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:qp_max_i",&tmp_115.data_offset,0x14);
    tmp_116.data_offset = 0;
    tmp_116.data_size = 0x90;
    tmp_115.data_type = 0x80000;
    tmp_115.flag_offset = 0x120;
    tmp_115.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:qp_step",&tmp_116.data_offset,0x14);
    tmp_117.data_offset = 0;
    tmp_117.data_size = 0x90;
    tmp_116.data_type = 0x100000;
    tmp_116.flag_offset = 0x124;
    tmp_116.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:qp_delta_ip",&tmp_117.data_offset,0x14);
    tmp_118.data_offset = 0;
    tmp_118.data_size = 0x348;
    tmp_117.data_type = 0x2000;
    tmp_117.flag_offset = 0x42c;
    tmp_117.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:sao_luma_disable",&tmp_118.data_offset,0x14);
    tmp_119.data_offset = 0;
    tmp_119.data_size = 0x348;
    tmp_118.data_type = 0x2000;
    tmp_118.flag_offset = 0x430;
    tmp_118.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:sao_chroma_disable",&tmp_119.data_offset,0x14);
    tmp_120.data_offset = 0;
    tmp_120.data_size = 0x348;
    tmp_119.data_type = 0x2000;
    tmp_119.flag_offset = 0x434;
    tmp_119.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:sao_bit_ratio",&tmp_120.data_offset,0x14);
    tmp_121.data_offset = 1;
    tmp_121.data_size = 0x348;
    tmp_120.data_type = 0x800000;
    tmp_120.flag_offset = 0x458;
    tmp_120.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:lpf_acs_sli_en",&tmp_121.data_offset,0x14);
    tmp_122.data_offset = 1;
    tmp_122.data_size = 0x348;
    tmp_121.data_type = 0x1000000;
    tmp_121.flag_offset = 0x45c;
    tmp_121.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:lpf_acs_tile_disable",&tmp_122.data_offset,0x14);
    tmp_123.data_offset = 0;
    tmp_123.data_size = 0x348;
    tmp_122.data_type = 0x400000;
    tmp_122.flag_offset = 0x454;
    tmp_122.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:auto_tile",&tmp_123.data_offset,0x14);
    tmp_124.data_offset = 0;
    tmp_124.data_size = 0x348;
    tmp_123.data_type = 0x8000000;
    tmp_123.flag_offset = 0x3c8;
    tmp_123.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:max_tid",&tmp_124.data_offset,0x14);
    tmp_125.data_offset = 0;
    tmp_125.data_size = 0x348;
    tmp_124.data_type = 0x10000000;
    tmp_124.flag_offset = 0x3c4;
    tmp_124.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:max_ltr",&tmp_125.data_offset,0x14);
    tmp_126.data_offset = 0;
    tmp_126.data_size = 0x348;
    tmp_125.data_type = 0x20000000;
    tmp_125.flag_offset = 0x3cc;
    tmp_125.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:base_layer_pid",&tmp_126.data_offset,0x14);
    tmp_127.data_offset = 0;
    tmp_127.data_size = 0x348;
    tmp_126.data_type = 0x2000000;
    tmp_126.flag_offset = 0x358;
    tmp_126.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:const_intra",&tmp_127.data_offset,0x14);
    tmp_128.data_offset = 0;
    tmp_128.data_size = 0x348;
    tmp_127.data_type = 0x4000000;
    tmp_127.flag_offset = 0x360;
    tmp_127.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"h265:lcu_size",&tmp_128.data_offset,0x14);
    tmp_129.data_offset = 0;
    tmp_129.data_size = 0x90;
    tmp_128.data_type = 0x10000;
    tmp_128.flag_offset = 0x10c;
    tmp_128.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"vp8:qp_init",&tmp_129.data_offset,0x14);
    tmp_130.data_offset = 0;
    tmp_130.data_size = 0x90;
    tmp_129.data_type = 0x20000;
    tmp_129.flag_offset = 0x118;
    tmp_129.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"vp8:qp_min",&tmp_130.data_offset,0x14);
    tmp_131.data_offset = 0;
    tmp_131.data_size = 0x90;
    tmp_130.data_type = 0x20000;
    tmp_130.flag_offset = 0x110;
    tmp_130.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"vp8:qp_max",&tmp_131.data_offset,0x14);
    tmp_132.data_offset = 0;
    tmp_132.data_size = 0x90;
    tmp_131.data_type = 0x40000;
    tmp_131.flag_offset = 0x11c;
    tmp_131.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"vp8:qp_min_i",&tmp_132.data_offset,0x14);
    tmp_133.data_offset = 0;
    tmp_133.data_size = 0x90;
    tmp_132.data_type = 0x40000;
    tmp_132.flag_offset = 0x114;
    tmp_132.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"vp8:qp_max_i",&tmp_133.data_offset,0x14);
    tmp_134.data_offset = 0;
    tmp_134.data_size = 0x90;
    tmp_133.data_type = 0x80000;
    tmp_133.flag_offset = 0x120;
    tmp_133.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"vp8:qp_step",&tmp_134.data_offset,0x14);
    tmp_135.data_offset = 0;
    tmp_135.data_size = 0x90;
    tmp_134.data_type = 0x100000;
    tmp_134.flag_offset = 0x124;
    tmp_134.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"vp8:qp_delta_ip",&tmp_135.data_offset,0x14);
    tmp_136.data_offset = 0;
    tmp_136.data_size = 0x348;
    tmp_135.data_type = CFG_FUNC_TYPE_S64;
    tmp_135.flag_offset = 0x368;
    tmp_135.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"vp8:disable_ivf",&tmp_136.data_offset,0x14);
    tmp_137.data_offset = 0;
    tmp_137.data_size = 0x348;
    tmp_136.data_type = CFG_FUNC_TYPE_U32;
    tmp_136.flag_offset = 0x34c;
    tmp_136.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"jpeg:quant",&tmp_137.data_offset,0x14);
    tmp_138.data_offset = 5;
    tmp_138.data_size = 0x348;
    tmp_137.data_type = CFG_FUNC_TYPE_S64;
    tmp_137.flag_offset = 0x360;
    tmp_137.flag_value = 8;
    mpp_trie_add_info(this->mTrie,"jpeg:qtable_y",&tmp_138.data_offset,0x14);
    tmp_139.data_offset = 5;
    tmp_139.data_size = 0x348;
    tmp_138.data_type = CFG_FUNC_TYPE_S64;
    tmp_138.flag_offset = 0x368;
    tmp_138.flag_value = 8;
    mpp_trie_add_info(this->mTrie,"jpeg:qtable_u",&tmp_139.data_offset,0x14);
    tmp_140.data_offset = 5;
    tmp_140.data_size = 0x348;
    tmp_139.data_type = CFG_FUNC_TYPE_S64;
    tmp_139.flag_offset = 0x370;
    tmp_139.flag_value = 8;
    mpp_trie_add_info(this->mTrie,"jpeg:qtable_v",&tmp_140.data_offset,0x14);
    tmp_141.data_offset = 0;
    tmp_141.data_size = 0x348;
    tmp_140.data_type = CFG_FUNC_TYPE_St;
    tmp_140.flag_offset = 0x350;
    tmp_140.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"jpeg:q_factor",&tmp_141.data_offset,0x14);
    tmp_142.data_offset = 0;
    tmp_142.data_size = 0x348;
    tmp_141.data_type = CFG_FUNC_TYPE_St;
    tmp_141.flag_offset = 0x354;
    tmp_141.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"jpeg:qf_max",&tmp_142.data_offset,0x14);
    tmp_143.data_offset = 0;
    tmp_143.data_size = 0x348;
    tmp_142.data_type = CFG_FUNC_TYPE_St;
    tmp_142.flag_offset = 0x358;
    tmp_142.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"jpeg:qf_min",&tmp_143.data_offset,0x14);
    tmp_144.data_offset = 1;
    tmp_144.data_size = 0xe90;
    tmp_143.data_type = CFG_FUNC_TYPE_U32;
    tmp_143.flag_offset = 0xe94;
    tmp_143.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"split:mode",&tmp_144.data_offset,0x14);
    tmp_145.data_offset = 1;
    tmp_145.data_size = 0xe90;
    tmp_144.data_type = CFG_FUNC_TYPE_S64;
    tmp_144.flag_offset = 0xe98;
    tmp_144.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"split:arg",&tmp_145.data_offset,0x14);
    tmp_146.data_offset = 1;
    tmp_146.data_size = 0xe90;
    tmp_145.data_type = CFG_FUNC_TYPE_St;
    tmp_145.flag_offset = 0xe9c;
    tmp_145.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"split:out",&tmp_146.data_offset,0x14);
    tmp_147.data_offset = 0;
    tmp_147.data_size = 0x178;
    tmp_146.data_type = CFG_FUNC_TYPE_U32;
    tmp_146.flag_offset = 0x17c;
    tmp_146.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:qp_row",&tmp_147.data_offset,0x14);
    tmp_148.data_offset = 0;
    tmp_148.data_size = 0x178;
    tmp_147.data_type = CFG_FUNC_TYPE_S64;
    tmp_147.flag_offset = 0x180;
    tmp_147.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:qp_row_i",&tmp_148.data_offset,0x14);
    tmp_149.data_offset = 4;
    tmp_149.data_size = 0x178;
    tmp_148.data_type = CFG_FUNC_TYPE_St;
    tmp_148.flag_offset = 0x198;
    tmp_148.flag_value = 0x40;
    mpp_trie_add_info(this->mTrie,"hw:aq_thrd_i",&tmp_149.data_offset,0x14);
    tmp_150.data_offset = 4;
    tmp_150.data_size = 0x178;
    tmp_149.data_type = 8;
    tmp_149.flag_offset = 0x1d8;
    tmp_149.flag_value = 0x40;
    mpp_trie_add_info(this->mTrie,"hw:aq_thrd_p",&tmp_150.data_offset,0x14);
    tmp_151.data_offset = 4;
    tmp_151.data_size = 0x178;
    tmp_150.data_type = 0x10;
    tmp_150.flag_offset = 0x218;
    tmp_150.flag_value = 0x40;
    mpp_trie_add_info(this->mTrie,"hw:aq_step_i",&tmp_151.data_offset,0x14);
    tmp_152.data_offset = 4;
    tmp_152.data_size = 0x178;
    tmp_151.data_type = 0x20;
    tmp_151.flag_offset = 600;
    tmp_151.flag_value = 0x40;
    mpp_trie_add_info(this->mTrie,"hw:aq_step_p",&tmp_152.data_offset,0x14);
    tmp_153.data_offset = 0;
    tmp_153.data_size = 0x178;
    tmp_152.data_type = 0x40;
    tmp_152.flag_offset = 0x298;
    tmp_152.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:mb_rc_disable",&tmp_153.data_offset,0x14);
    tmp_154.data_offset = 4;
    tmp_154.data_size = 0x178;
    tmp_153.data_type = 0x2000;
    tmp_153.flag_offset = 0x314;
    tmp_153.flag_value = 0x28;
    mpp_trie_add_info(this->mTrie,"hw:aq_rnge_arr",&tmp_154.data_offset,0x14);
    tmp_155.data_offset = 4;
    tmp_155.data_size = 0x178;
    tmp_154.data_type = 0x100;
    tmp_154.flag_offset = 0x2a0;
    tmp_154.flag_value = 0x20;
    mpp_trie_add_info(this->mTrie,"hw:mode_bias",&tmp_155.data_offset,0x14);
    tmp_156.data_offset = 0;
    tmp_156.data_size = 0x178;
    tmp_155.data_type = 0x200;
    tmp_155.flag_offset = 0x2c0;
    tmp_155.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:skip_bias_en",&tmp_156.data_offset,0x14);
    tmp_157.data_offset = 0;
    tmp_157.data_size = 0x178;
    tmp_156.data_type = 0x200;
    tmp_156.flag_offset = 0x2c4;
    tmp_156.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:skip_sad",&tmp_157.data_offset,0x14);
    tmp_158.data_offset = 0;
    tmp_158.data_size = 0x178;
    tmp_157.data_type = 0x200;
    tmp_157.flag_offset = 0x2c8;
    tmp_157.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:skip_bias",&tmp_158.data_offset,0x14);
    tmp_159.data_offset = 0;
    tmp_159.data_size = 0x178;
    tmp_158.data_type = 0x400;
    tmp_158.flag_offset = 0x184;
    tmp_158.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:qbias_i",&tmp_159.data_offset,0x14);
    tmp_160.data_offset = 0;
    tmp_160.data_size = 0x178;
    tmp_159.data_type = 0x800;
    tmp_159.flag_offset = 0x188;
    tmp_159.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:qbias_p",&tmp_160.data_offset,0x14);
    tmp_161.data_offset = 0;
    tmp_161.data_size = 0x178;
    tmp_160.data_type = 0x1000;
    tmp_160.flag_offset = 0x18c;
    tmp_160.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:qbias_en",&tmp_161.data_offset,0x14);
    tmp_162.data_offset = 4;
    tmp_162.data_size = 0x178;
    tmp_161.data_type = 0x4000;
    tmp_161.flag_offset = 0x2cc;
    tmp_161.flag_value = 0x48;
    mpp_trie_add_info(this->mTrie,"hw:qbias_arr",&tmp_162.data_offset,0x14);
    tmp_163.data_offset = 0;
    tmp_163.data_size = 0x178;
    tmp_162.data_type = 0x8000;
    tmp_162.flag_offset = 400;
    tmp_162.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:flt_str_i",&tmp_163.data_offset,0x14);
    tmp_164.data_offset = 0;
    tmp_164.data_size = 0x178;
    tmp_163.data_type = 0x10000;
    tmp_163.flag_offset = 0x194;
    tmp_163.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"hw:flt_str_p",&tmp_164.data_offset,0x14);
    tmp_165.data_offset = 0;
    tmp_165.data_size = 0x1860;
    tmp_164.data_type = CFG_FUNC_TYPE_U32;
    tmp_164.flag_offset = 0x1864;
    tmp_164.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:scene_mode",&tmp_165.data_offset,0x14);
    tmp_166.data_offset = 0;
    tmp_166.data_size = 0x1860;
    tmp_165.data_type = CFG_FUNC_TYPE_S64;
    tmp_165.flag_offset = 0x1868;
    tmp_165.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:deblur_en",&tmp_166.data_offset,0x14);
    tmp_167.data_offset = 0;
    tmp_167.data_size = 0x1860;
    tmp_166.data_type = CFG_FUNC_TYPE_St;
    tmp_166.flag_offset = 0x186c;
    tmp_166.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:deblur_str",&tmp_167.data_offset,0x14);
    tmp_168.data_offset = 0;
    tmp_168.data_size = 0x1860;
    tmp_167.data_type = 8;
    tmp_167.flag_offset = 0x1870;
    tmp_167.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:anti_flicker_str",&tmp_168.data_offset,0x14);
    tmp_169.data_offset = 0;
    tmp_169.data_size = 0x1860;
    tmp_168.data_type = 0x20;
    tmp_168.flag_offset = 0x1874;
    tmp_168.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:lambda_idx_i",&tmp_169.data_offset,0x14);
    tmp_170.data_offset = 0;
    tmp_170.data_size = 0x1860;
    tmp_169.data_type = 0x40;
    tmp_169.flag_offset = 0x1878;
    tmp_169.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:lambda_idx_p",&tmp_170.data_offset,0x14);
    tmp_171.data_offset = 0;
    tmp_171.data_size = 0x1860;
    tmp_170.data_type = 0x80;
    tmp_170.flag_offset = 0x187c;
    tmp_170.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:atr_str_i",&tmp_171.data_offset,0x14);
    tmp_172.data_offset = 0;
    tmp_172.data_size = 0x1860;
    tmp_171.data_type = 0x100;
    tmp_171.flag_offset = 0x1880;
    tmp_171.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:atr_str_p",&tmp_172.data_offset,0x14);
    tmp_173.data_offset = 0;
    tmp_173.data_size = 0x1860;
    tmp_172.data_type = 0x200;
    tmp_172.flag_offset = 0x1884;
    tmp_172.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:atl_str",&tmp_173.data_offset,0x14);
    tmp_174.data_offset = 0;
    tmp_174.data_size = 0x1860;
    tmp_173.data_type = 0x400;
    tmp_173.flag_offset = 0x1888;
    tmp_173.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:sao_str_i",&tmp_174.data_offset,0x14);
    tmp_175.data_offset = 0;
    tmp_175.data_size = 0x1860;
    tmp_174.data_type = 0x800;
    tmp_174.flag_offset = 0x188c;
    tmp_174.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:sao_str_p",&tmp_175.data_offset,0x14);
    tmp_176.data_offset = 0;
    tmp_176.data_size = 0x1860;
    tmp_175.data_type = 0x2000;
    tmp_175.flag_offset = 0x1890;
    tmp_175.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:rc_container",&tmp_176.data_offset,0x14);
    tmp_177.data_offset = 0;
    tmp_177.data_size = 0x1860;
    tmp_176.data_type = 0x4000;
    tmp_176.flag_offset = 0x1894;
    tmp_176.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:vmaf_opt",&tmp_177.data_offset,0x14);
    tmp_178.data_offset = 0;
    tmp_178.data_size = 0x1860;
    tmp_177.data_type = 0x8000;
    tmp_177.flag_offset = 0x1898;
    tmp_177.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:motion_static_switch_enable",&tmp_178.data_offset,0x14);
    tmp_179.data_offset = 0;
    tmp_179.data_size = 0x1860;
    tmp_178.data_type = 0x10000;
    tmp_178.flag_offset = 0x189c;
    tmp_178.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:atf_str",&tmp_179.data_offset,0x14);
    tmp_180.data_offset = 0;
    tmp_180.data_size = 0x1860;
    tmp_179.data_type = 0x20000;
    tmp_179.flag_offset = 0x18a0;
    tmp_179.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:lgt_chg_lvl",&tmp_180.data_offset,0x14);
    tmp_181.data_offset = 0;
    tmp_181.data_size = 0x1860;
    tmp_180.data_type = 0x40000;
    tmp_180.flag_offset = 0x18a4;
    tmp_180.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:static_frm_num",&tmp_181.data_offset,0x14);
    tmp_182.data_offset = 0;
    tmp_182.data_size = 0x1860;
    tmp_181.data_type = 0x80000;
    tmp_181.flag_offset = 0x18a8;
    tmp_181.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:madp16_th",&tmp_182.data_offset,0x14);
    tmp_183.data_offset = 0;
    tmp_183.data_size = 0x1860;
    tmp_182.data_type = 0x100000;
    tmp_182.flag_offset = 0x18ac;
    tmp_182.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:skip16_wgt",&tmp_183.data_offset,0x14);
    tmp_184.data_offset = 0;
    tmp_184.data_size = 0x1860;
    tmp_183.data_type = 0x200000;
    tmp_183.flag_offset = 0x18b0;
    tmp_183.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:skip32_wgt",&tmp_184.data_offset,0x14);
    local_e88 = 0x186000000000;
    tmp_184.data_type = 0x400000;
    tmp_184.flag_offset = 0x18b8;
    tmp_184.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"tune:speed",&local_e88,0x14);
    mpp_trie_add_info(this->mTrie,(char *)0x0,(void *)0x0,0);
    RVar2 = mpp_trie_get_node_count(this->mTrie);
    (this->mHead).node_count = RVar2;
    RVar2 = mpp_trie_get_info_count(this->mTrie);
    (this->mHead).info_count = RVar2;
    RVar2 = mpp_trie_get_buf_size(this->mTrie);
    (this->mHead).info_size = RVar2;
    if ((mpp_enc_cfg_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_cfg","node cnt: %d\n","MppEncCfgService",
                 (ulong)(uint)(this->mHead).node_count);
    }
  }
  else {
    _mpp_log_l(2,"mpp_enc_cfg","failed to init enc cfg set trie ret %d\n","MppEncCfgService",
               (ulong)(uint)MVar1);
  }
  return;
}

Assistant:

MppEncCfgService::MppEncCfgService() :
    mTrie(NULL)
{
    MPP_RET ret;

    mpp_env_get_u32("mpp_enc_cfg_debug", &mpp_enc_cfg_debug, 0);

    ret = mpp_trie_init(&mTrie, "MppEncCfg");
    if (ret) {
        mpp_err_f("failed to init enc cfg set trie ret %d\n", ret);
        return ;
    }

    ENTRY_TABLE(EXPAND_AS_TRIE)

    mpp_trie_add_info(mTrie, NULL, NULL, 0);

    mHead.node_count = mpp_trie_get_node_count(mTrie);
    mHead.info_count = mpp_trie_get_info_count(mTrie);
    mHead.info_size = mpp_trie_get_buf_size(mTrie);

    mpp_enc_cfg_dbg_func("node cnt: %d\n", mHead.node_count);
}